

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O3

bool __thiscall google::protobuf::io::CordInputStream::Skip(CordInputStream *this,int count)

{
  ulong skip;
  ulong skip_00;
  
  skip_00 = (ulong)count;
  if (this->available_ < skip_00) {
    skip = this->bytes_remaining_;
    if (skip_00 <= skip) {
      NextChunk(this,skip_00);
    }
    else {
      NextChunk(this,skip);
    }
    return skip_00 <= skip;
  }
  this->available_ = this->available_ - skip_00;
  this->bytes_remaining_ = this->bytes_remaining_ - skip_00;
  return true;
}

Assistant:

bool CordInputStream::Skip(int count) {
  // Short circuit if we stay inside the current chunk.
  if (static_cast<size_t>(count) <= available_) {
    available_ -= count;
    bytes_remaining_ -= count;
    return true;
  }

  // Sanity check the skip count.
  if (static_cast<size_t>(count) <= bytes_remaining_) {
    // Skip to end: do not return EOF condition: skipping into EOF is ok.
    NextChunk(count);
    return true;
  }
  NextChunk(bytes_remaining_);
  return false;
}